

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityAssertNumbersWithin
               (UNITY_UINT delta,UNITY_INT expected,UNITY_INT actual,char *msg,UNITY_UINT lineNumber
               ,UNITY_DISPLAY_STYLE_T style)

{
  ulong uVar1;
  
  if (Unity.CurrentTestIgnored != 0 || Unity.CurrentTestFailed != 0) {
    return;
  }
  if ((style & 0x10) == 0) {
    uVar1 = actual - expected;
    if ((ulong)expected <= (ulong)actual && uVar1 != 0) goto LAB_0010228c;
  }
  else {
    uVar1 = actual - expected;
    if (uVar1 != 0 && expected <= actual) goto LAB_0010228c;
  }
  uVar1 = expected - actual;
LAB_0010228c:
  Unity.CurrentTestFailed = (UNITY_UINT)(delta < uVar1);
  if (uVar1 <= delta) {
    return;
  }
  UnityTestResultsFailBegin(lineNumber);
  UnityPrint(" Values Not Within Delta ");
  UnityPrintNumberByStyle(delta,style);
  UnityPrint(" Expected ");
  UnityPrintNumberByStyle(expected,style);
  UnityPrint(" Was ");
  UnityPrintNumberByStyle(actual,style);
  UnityAddMsgIfSpecified(msg);
  Unity.CurrentTestFailed = 1;
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertNumbersWithin(const UNITY_UINT delta,
                              const UNITY_INT expected,
                              const UNITY_INT actual,
                              const char* msg,
                              const UNITY_LINE_TYPE lineNumber,
                              const UNITY_DISPLAY_STYLE_T style)
{
    RETURN_IF_FAIL_OR_IGNORE;

    if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
    {
        if (actual > expected)
          Unity.CurrentTestFailed = (UNITY_UINT)((UNITY_UINT)(actual - expected) > delta);
        else
            Unity.CurrentTestFailed = (UNITY_UINT)((UNITY_UINT)(expected - actual) > delta);
    }
    else
    {
        if ((UNITY_UINT)actual > (UNITY_UINT)expected)
            Unity.CurrentTestFailed = (UNITY_UINT)((UNITY_UINT)(actual - expected) > delta);
        else
            Unity.CurrentTestFailed = (UNITY_UINT)((UNITY_UINT)(expected - actual) > delta);
    }

    if (Unity.CurrentTestFailed)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrDelta);
        UnityPrintNumberByStyle((UNITY_INT)delta, style);
        UnityPrint(UnityStrExpected);
        UnityPrintNumberByStyle(expected, style);
        UnityPrint(UnityStrWas);
        UnityPrintNumberByStyle(actual, style);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}